

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

void slang::lshrFar(uint64_t *dst,uint64_t *src,uint32_t wordShift,uint32_t offset,uint32_t start,
                   uint32_t numWords)

{
  uint uVar1;
  byte bVar2;
  uint32_t i_1;
  uint32_t breakWord;
  uint32_t i;
  uint32_t numWords_local;
  uint32_t start_local;
  uint32_t offset_local;
  uint32_t wordShift_local;
  uint64_t *src_local;
  uint64_t *dst_local;
  
  i = start;
  if (wordShift == 0) {
    for (; i < (start + numWords) - offset; i = i + 1) {
      dst[i] = src[i + offset];
    }
  }
  else {
    uVar1 = ((start + numWords) - offset) - 1;
    for (i_1 = start; bVar2 = (byte)wordShift, i_1 < uVar1; i_1 = i_1 + 1) {
      dst[i_1] = src[i_1 + offset] >> (bVar2 & 0x3f) |
                 src[i_1 + offset + 1] << (0x40 - bVar2 & 0x3f);
    }
    dst[uVar1] = src[uVar1 + offset] >> (bVar2 & 0x3f);
  }
  return;
}

Assistant:

static void lshrFar(uint64_t* dst, uint64_t* src, uint32_t wordShift, uint32_t offset,
                    uint32_t start, uint32_t numWords) {
    // this function is split out so that if we have an unknown value we can reuse the code
    // optimization: move whole words
    if (wordShift == 0) {
        for (uint32_t i = start; i < start + numWords - offset; i++)
            dst[i] = src[i + offset];
    }
    else {
        // shift low order words
        uint32_t breakWord = start + numWords - offset - 1;
        for (uint32_t i = start; i < breakWord; i++) {
            dst[i] = (src[i + offset] >> wordShift) |
                     (src[i + offset + 1] << (SVInt::BITS_PER_WORD - wordShift));
        }

        // shift the "break" word
        dst[breakWord] = src[breakWord + offset] >> wordShift;
    }
}